

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrprecond.h
# Opt level: O2

void __thiscall
TPZDohrPrecond<long_double,_TPZDohrSubstruct<long_double>_>::CopyFrom
          (TPZDohrPrecond<long_double,_TPZDohrSubstruct<long_double>_> *this,
          TPZMatrix<long_double> *mat)

{
  TPZDohrPrecond<long_double,_TPZDohrSubstruct<long_double>_> *pTVar1;
  
  if (mat != (TPZMatrix<long_double> *)0x0) {
    pTVar1 = (TPZDohrPrecond<long_double,_TPZDohrSubstruct<long_double>_> *)
             __dynamic_cast(mat,&TPZMatrix<long_double>::typeinfo,
                            &TPZDohrPrecond<long_double,TPZDohrSubstruct<long_double>>::typeinfo,0);
    if (pTVar1 != (TPZDohrPrecond<long_double,_TPZDohrSubstruct<long_double>_> *)0x0) {
      operator=(this,pTVar1);
      return;
    }
  }
  std::operator<<((ostream *)&std::cerr,
                  "virtual void TPZDohrPrecond<long double, TPZDohrSubstruct<long double>>::CopyFrom(const TPZMatrix<TVar> *) [TVar = long double, TSubStruct = TPZDohrSubstruct<long double>]"
                 );
  std::operator<<((ostream *)&std::cerr,"\nERROR: Called with incompatible type\n.");
  std::operator<<((ostream *)&std::cerr,"Aborting...\n");
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/SubStruct/tpzdohrprecond.h"
             ,0x50);
}

Assistant:

void CopyFrom(const TPZMatrix<TVar> *  mat) override        
  {                                                           
    auto *from = dynamic_cast<const TPZDohrPrecond<TVar,TSubStruct> *>(mat);                
    if (from) {                                               
      *this = *from;                                          
    }                                                         
    else                                                      
      {                                                       
        PZError<<__PRETTY_FUNCTION__;                         
        PZError<<"\nERROR: Called with incompatible type\n."; 
        PZError<<"Aborting...\n";                             
        DebugStop();                                          
      }                                                       
  }